

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

shared_ptr<hrgls_StreamProperties_> __thiscall
hrgls::StreamProperties::GetRawProperties(StreamProperties *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<hrgls_StreamProperties_> sVar1;
  
  if ((__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2> *)*in_RSI ==
      (__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->m_private).
    super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->m_private).
    super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2> *)*in_RSI);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar1.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar1.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<hrgls_StreamProperties_>)
         sVar1.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<hrgls_StreamProperties_> StreamProperties::GetRawProperties() const
  {
    if (!m_private) {
      return nullptr;
    }
    return m_private->m_state;
  }